

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapScriptFunctionInfoEx
               (SnapScriptFunctionInfo *snapFuncInfo,ScriptFunction *func,InflateMap *inflator)

{
  RecyclableObject *pRVar1;
  ActivationObjectEx *pAVar2;
  FrameDisplay *environment;
  Var pvVar3;
  
  if (snapFuncInfo->CachedScopeObjId != 0) {
    pRVar1 = InflateMap::LookupObject(inflator,snapFuncInfo->CachedScopeObjId);
    pAVar2 = Js::VarTo<Js::ActivationObjectEx,Js::RecyclableObject>(pRVar1);
    Memory::Recycler::WBSetBit((char *)&func->cachedScopeObj);
    (func->cachedScopeObj).ptr = pAVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&func->cachedScopeObj);
  }
  if (snapFuncInfo->HomeObjId != 0) {
    pRVar1 = InflateMap::LookupObject(inflator,snapFuncInfo->HomeObjId);
    (*(func->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x74])(func,pRVar1);
  }
  if (snapFuncInfo->ScopeId != 0) {
    environment = InflateMap::LookupEnvironment(inflator,snapFuncInfo->ScopeId);
    Js::ScriptFunction::SetEnvironment(func,environment);
  }
  if (snapFuncInfo->ComputedNameInfo != (TTDVar)0x0) {
    pvVar3 = InflateMap::InflateTTDVar(inflator,snapFuncInfo->ComputedNameInfo);
    (*(func->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x75])(func,pvVar3);
    return;
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapScriptFunctionInfoEx(const SnapScriptFunctionInfo* snapFuncInfo, Js::ScriptFunction* func, InflateMap* inflator)
        {
            if(snapFuncInfo->CachedScopeObjId != TTD_INVALID_PTR_ID)
            {
                func->SetCachedScope(Js::VarTo<Js::ActivationObjectEx>(inflator->LookupObject(snapFuncInfo->CachedScopeObjId)));
            }

            if(snapFuncInfo->HomeObjId != TTD_INVALID_PTR_ID)
            {
                func->SetHomeObj(inflator->LookupObject(snapFuncInfo->HomeObjId));
            }

            if(snapFuncInfo->ScopeId != TTD_INVALID_PTR_ID)
            {
                Js::FrameDisplay* environment = inflator->LookupEnvironment(snapFuncInfo->ScopeId);
                func->SetEnvironment(environment);
            }

            if(snapFuncInfo->ComputedNameInfo != nullptr)
            {
                Js::Var cNameVar = inflator->InflateTTDVar(snapFuncInfo->ComputedNameInfo);
                func->SetComputedNameVar(cNameVar);
            }
        }